

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O0

HelicsEndpoint
helicsFederateRegisterTargetedEndpoint(HelicsFederate fed,char *name,char *type,HelicsError *err)

{
  string_view eptName;
  bool bVar1;
  Endpoint *pEVar2;
  pointer pEVar3;
  FedObject *pFVar4;
  size_t in_RCX;
  char *in_RDX;
  long in_RSI;
  __single_object end;
  shared_ptr<helics::MessageFederate> fedObj;
  shared_ptr<helics::MessageFederate> *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  HelicsError *err_00;
  char *in_stack_ffffffffffffff58;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff60;
  unique_ptr<helics::EndpointObject,_std::default_delete<helics::EndpointObject>_> *this;
  HelicsFederate in_stack_ffffffffffffff68;
  unique_ptr<helics::EndpointObject,_std::default_delete<helics::EndpointObject>_> local_80;
  __sv_type local_78;
  __sv_type local_68;
  unique_ptr<helics::EndpointObject,_std::default_delete<helics::EndpointObject>_>
  *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  string_view in_stack_ffffffffffffffc8;
  HelicsEndpoint local_8;
  
  getMessageFedSharedPtr(in_stack_ffffffffffffff68,(HelicsError *)in_stack_ffffffffffffff60);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&stack0xffffffffffffffc8);
  if (bVar1) {
    std::make_unique<helics::EndpointObject>();
    std::__shared_ptr_access<helics::MessageFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<helics::MessageFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1dd337);
    if (in_RSI == 0) {
      local_68 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff50)
      ;
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    }
    if (in_RDX == (char *)0x0) {
      local_78 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff50)
      ;
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    }
    eptName._M_str = in_RDX;
    eptName._M_len = in_RCX;
    pEVar2 = helics::MessageFederate::registerTargetedEndpoint
                       ((MessageFederate *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),eptName,
                        in_stack_ffffffffffffffc8);
    err_00 = (HelicsError *)&stack0xffffffffffffffb8;
    pEVar3 = std::unique_ptr<helics::EndpointObject,_std::default_delete<helics::EndpointObject>_>::
             operator->((unique_ptr<helics::EndpointObject,_std::default_delete<helics::EndpointObject>_>
                         *)0x1dd3da);
    pEVar3->endPtr = pEVar2;
    std::unique_ptr<helics::EndpointObject,_std::default_delete<helics::EndpointObject>_>::
    operator->((unique_ptr<helics::EndpointObject,_std::default_delete<helics::EndpointObject>_> *)
               0x1dd3ec);
    std::shared_ptr<helics::MessageFederate>::operator=
              ((shared_ptr<helics::MessageFederate> *)err_00,in_stack_ffffffffffffff48);
    pFVar4 = helics::getFedObject(in_stack_ffffffffffffff58,err_00);
    pEVar3 = std::unique_ptr<helics::EndpointObject,_std::default_delete<helics::EndpointObject>_>::
             operator->((unique_ptr<helics::EndpointObject,_std::default_delete<helics::EndpointObject>_>
                         *)0x1dd41f);
    pEVar3->fed = pFVar4;
    this = &local_80;
    std::unique_ptr<helics::EndpointObject,_std::default_delete<helics::EndpointObject>_>::
    unique_ptr((unique_ptr<helics::EndpointObject,_std::default_delete<helics::EndpointObject>_> *)
               err_00,(unique_ptr<helics::EndpointObject,_std::default_delete<helics::EndpointObject>_>
                       *)pFVar4);
    local_8 = anon_unknown.dwarf_784a3::addEndpoint
                        ((HelicsFederate)
                         CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                         in_stack_ffffffffffffffb8);
    std::unique_ptr<helics::EndpointObject,_std::default_delete<helics::EndpointObject>_>::
    ~unique_ptr(this);
    std::unique_ptr<helics::EndpointObject,_std::default_delete<helics::EndpointObject>_>::
    ~unique_ptr(this);
  }
  else {
    local_8 = (HelicsEndpoint)0x0;
  }
  std::shared_ptr<helics::MessageFederate>::~shared_ptr
            ((shared_ptr<helics::MessageFederate> *)0x1dd52c);
  return local_8;
}

Assistant:

HelicsEndpoint helicsFederateRegisterTargetedEndpoint(HelicsFederate fed, const char* name, const char* type, HelicsError* err)
{
    // now generate a generic endpoint
    auto fedObj = getMessageFedSharedPtr(fed, err);
    if (!fedObj) {
        return nullptr;
    }
    try {
        auto end = std::make_unique<helics::EndpointObject>();
        end->endPtr = &fedObj->registerTargetedEndpoint(AS_STRING_VIEW(name), AS_STRING_VIEW(type));
        end->fedptr = std::move(fedObj);
        end->fed = helics::getFedObject(fed, nullptr);
        return addEndpoint(fed, std::move(end));
    }
    catch (...) {
        helicsErrorHandler(err);
        return nullptr;
    }
    return nullptr;
}